

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O0

void rcg::convYCbCr422toQuadRGB(uint8_t *rgb,uint8_t *row,int i)

{
  uchar *puVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  int in_EDX;
  long in_RSI;
  uchar *in_RDI;
  int j;
  int bc;
  int gc;
  int rc;
  int Cr;
  int Cb;
  int Y [2];
  int k;
  int local_38;
  uint local_20 [4];
  long local_10;
  uchar *local_8;
  
  local_20[3] = (in_EDX >> 2) << 3;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_20[2] = 0; (int)local_20[2] < 8; local_20[2] = local_20[2] + 4) {
    local_20[0] = (uint)*(byte *)(local_10 + (int)(local_20[3] + local_20[2]));
    local_20[1] = (uint)*(byte *)(local_10 + (int)(local_20[3] + 2 + local_20[2]));
    iVar3 = *(byte *)(local_10 + (int)(local_20[3] + 1 + local_20[2])) - 0x80;
    iVar4 = *(byte *)(local_10 + (int)(local_20[3] + 3 + local_20[2])) - 0x80;
    for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
      uVar2 = anon_unknown_4::clamp8(local_20[local_38] + (iVar4 * 0x5a + 0x4020 >> 6) + -0x100);
      puVar1 = local_8;
      local_8 = local_8 + 1;
      *puVar1 = uVar2;
      uVar2 = anon_unknown_4::clamp8
                        (local_20[local_38] + (iVar3 * -0x16 + iVar4 * -0x2e + 0x4020 >> 6) + -0x100
                        );
      puVar1 = local_8;
      local_8 = local_8 + 1;
      *puVar1 = uVar2;
      uVar2 = anon_unknown_4::clamp8(local_20[local_38] + (iVar3 * 0x71 + 0x4020 >> 6) + -0x100);
      puVar1 = local_8;
      local_8 = local_8 + 1;
      *puVar1 = uVar2;
    }
  }
  return;
}

Assistant:

void convYCbCr422toQuadRGB(uint8_t rgb[12], const uint8_t *row, int i)
{
  i=(i>>2)*8;

  for (int k=0; k<8; k+=4)
  {
    const int Y[2]={row[i+k], row[i+2+k]};
    const int Cb=static_cast<int>(row[i+1+k])-128;
    const int Cr=static_cast<int>(row[i+3+k])-128;

    // conversion of YCbCr into RGB with correct rounding
    const int rc=((90*Cr+16384+32)>>6)-256;
    const int gc=((-22*Cb-46*Cr+16384+32)>>6)-256;
    const int bc=((113*Cb+16384+32)>>6)-256;

    for (int j=0; j<2; j++)
    {
      *rgb++=clamp8(Y[j]+rc);
      *rgb++=clamp8(Y[j]+gc);
      *rgb++=clamp8(Y[j]+bc);
    }
  }
}